

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ImplementsClauseSyntax::ImplementsClauseSyntax
          (ImplementsClauseSyntax *this,Token keyword,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *interfaces)

{
  bool bVar1;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_RDI;
  NameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_ffffffffffffffb0;
  
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,ImplementsClause);
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffffb0,in_RDI);
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x50c60a);
  SeparatedSyntaxList<slang::syntax::NameSyntax>::end(in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffb0,
                       (iterator_base<slang::syntax::NameSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb0 =
         (SeparatedSyntaxList<slang::syntax::NameSyntax> *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                      *)0x50c649);
    *(SeparatedSyntaxList<slang::syntax::NameSyntax> **)
     &(in_stack_ffffffffffffffb0->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

ImplementsClauseSyntax(Token keyword, const SeparatedSyntaxList<NameSyntax>& interfaces) :
        SyntaxNode(SyntaxKind::ImplementsClause), keyword(keyword), interfaces(interfaces) {
        this->interfaces.parent = this;
        for (auto child : this->interfaces)
            child->parent = this;
    }